

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# altsvc.c
# Opt level: O3

_Bool Curl_altsvc_lookup(altsvcinfo *asi,alpnid srcalpnid,char *srchost,int srcport,
                        altsvc **dstentry,int versions)

{
  altsvc *paVar1;
  Curl_llist_element *pCVar2;
  int iVar3;
  time_t tVar4;
  Curl_llist_element *e;
  
  tVar4 = time((time_t *)0x0);
  e = (asi->list).head;
  if (e != (Curl_llist_element *)0x0) {
    do {
      paVar1 = (altsvc *)e->ptr;
      pCVar2 = e->next;
      if (paVar1->expires < tVar4) {
        Curl_llist_remove(&asi->list,e,(void *)0x0);
        (*Curl_cfree)((paVar1->src).host);
        (*Curl_cfree)((paVar1->dst).host);
        (*Curl_cfree)(paVar1);
      }
      else if (((((paVar1->src).alpnid == srcalpnid) &&
                (iVar3 = Curl_strcasecompare((paVar1->src).host,srchost), iVar3 != 0)) &&
               ((uint)(paVar1->src).port == srcport)) &&
              (((paVar1->dst).alpnid & versions) != ALPN_none)) {
        *dstentry = paVar1;
        return true;
      }
      e = pCVar2;
    } while (pCVar2 != (Curl_llist_element *)0x0);
  }
  return false;
}

Assistant:

bool Curl_altsvc_lookup(struct altsvcinfo *asi,
                        enum alpnid srcalpnid, const char *srchost,
                        int srcport,
                        struct altsvc **dstentry,
                        const int versions) /* one or more bits */
{
  struct Curl_llist_element *e;
  struct Curl_llist_element *n;
  time_t now = time(NULL);
  DEBUGASSERT(asi);
  DEBUGASSERT(srchost);
  DEBUGASSERT(dstentry);

  for(e = asi->list.head; e; e = n) {
    struct altsvc *as = e->ptr;
    n = e->next;
    if(as->expires < now) {
      /* an expired entry, remove */
      Curl_llist_remove(&asi->list, e, NULL);
      altsvc_free(as);
      continue;
    }
    if((as->src.alpnid == srcalpnid) &&
       strcasecompare(as->src.host, srchost) &&
       (as->src.port == srcport) &&
       (versions & as->dst.alpnid)) {
      /* match */
      *dstentry = as;
      return TRUE;
    }
  }
  return FALSE;
}